

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O0

int mbedtls_ssl_get_ciphersuite_id(char *ciphersuite_name)

{
  mbedtls_ssl_ciphersuite_t *pmVar1;
  mbedtls_ssl_ciphersuite_t *cur;
  char *ciphersuite_name_local;
  
  pmVar1 = mbedtls_ssl_ciphersuite_from_string(ciphersuite_name);
  if (pmVar1 == (mbedtls_ssl_ciphersuite_t *)0x0) {
    ciphersuite_name_local._4_4_ = 0;
  }
  else {
    ciphersuite_name_local._4_4_ = pmVar1->id;
  }
  return ciphersuite_name_local._4_4_;
}

Assistant:

int mbedtls_ssl_get_ciphersuite_id( const char *ciphersuite_name )
{
    const mbedtls_ssl_ciphersuite_t *cur;

    cur = mbedtls_ssl_ciphersuite_from_string( ciphersuite_name );

    if( cur == NULL )
        return( 0 );

    return( cur->id );
}